

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O0

void __thiscall
wabt::(anonymous_namespace)::WatWriter::
WriteMemoryLoadStoreExpr<wabt::LoadStoreExpr<(wabt::ExprType)49>>(WatWriter *this,Expr *expr)

{
  bool bVar1;
  LoadStoreExpr<(wabt::ExprType)49> *pLVar2;
  char *s;
  LoadStoreExpr<(wabt::ExprType)49> *typed_expr;
  Expr *expr_local;
  WatWriter *this_local;
  
  pLVar2 = cast<wabt::LoadStoreExpr<(wabt::ExprType)49>,wabt::Expr>(expr);
  s = Opcode::GetName(&pLVar2->opcode);
  anon_unknown_1::WatWriter::WritePutsSpace((WatWriter *)this,s);
  anon_unknown_1::WatWriter::WriteMemoryVarUnlessZero
            ((WatWriter *)this,&(pLVar2->super_MemoryExpr<(wabt::ExprType)49>).memidx,Space);
  if (pLVar2->offset != 0) {
    anon_unknown_1::WatWriter::Writef((WatWriter *)this,"offset=%lu",pLVar2->offset);
  }
  bVar1 = Opcode::IsNaturallyAligned(&pLVar2->opcode,pLVar2->align);
  if (!bVar1) {
    anon_unknown_1::WatWriter::Writef((WatWriter *)this,"align=%lu",pLVar2->align);
  }
  anon_unknown_1::WatWriter::WriteNewline((WatWriter *)this,false);
  return;
}

Assistant:

void WatWriter::WriteMemoryLoadStoreExpr(const Expr* expr) {
  auto typed_expr = cast<T>(expr);
  WritePutsSpace(typed_expr->opcode.GetName());
  WriteMemoryVarUnlessZero(typed_expr->memidx, NextChar::Space);
  if (typed_expr->offset) {
    Writef("offset=%" PRIaddress, typed_expr->offset);
  }
  if (!typed_expr->opcode.IsNaturallyAligned(typed_expr->align)) {
    Writef("align=%" PRIaddress, typed_expr->align);
  }
  WriteNewline(NO_FORCE_NEWLINE);
}